

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

BinsSelectExpressionSyntax * __thiscall slang::parsing::Parser::parseBinsSelectPrimary(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  BinSelectWithFilterExprSyntax *expr;
  BinsSelectConditionExprSyntax *expr_00;
  BinsSelectExpressionSyntax *expr_01;
  ExpressionSyntax *pEVar3;
  ExpressionSyntax *pEVar4;
  ExpressionPatternSyntax *pEVar5;
  MatchesClauseSyntax *pMVar6;
  Token TVar7;
  Token TVar8;
  Token closeParen;
  Token matchesKeyword;
  
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar7.kind;
  if (TVar2 == OpenParenthesis) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    expr_01 = parseBinsSelectExpression(this);
    TVar8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    expr = (BinSelectWithFilterExprSyntax *)
           slang::syntax::SyntaxFactory::parenthesizedBinsSelectExpr
                     (&this->factory,TVar7,expr_01,TVar8);
  }
  else if (TVar2 == Exclamation) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    expr_00 = parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)this);
    expr = (BinSelectWithFilterExprSyntax *)
           slang::syntax::SyntaxFactory::unaryBinsSelectExpr(&this->factory,TVar7,expr_00);
  }
  else if (TVar2 == BinsOfKeyword) {
    expr = (BinSelectWithFilterExprSyntax *)
           parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)this);
  }
  else {
    pMVar6 = (MatchesClauseSyntax *)0x0;
    pEVar3 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x40,0);
    bVar1 = ParserBase::peek(&this->super_ParserBase,MatchesKeyword);
    if (bVar1) {
      TVar7 = ParserBase::consume(&this->super_ParserBase);
      pEVar4 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x40,0);
      pEVar5 = slang::syntax::SyntaxFactory::expressionPattern(&this->factory,pEVar4);
      pMVar6 = slang::syntax::SyntaxFactory::matchesClause
                         (&this->factory,TVar7,&pEVar5->super_PatternSyntax);
    }
    expr = (BinSelectWithFilterExprSyntax *)
           slang::syntax::SyntaxFactory::simpleBinsSelectExpr(&this->factory,pEVar3,pMVar6);
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,WithKeyword);
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    TVar8 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    pEVar3 = parseExpression(this);
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    bVar1 = ParserBase::peek(&this->super_ParserBase,MatchesKeyword);
    if (bVar1) {
      matchesKeyword = ParserBase::consume(&this->super_ParserBase);
      pEVar4 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x40,0);
      pEVar5 = slang::syntax::SyntaxFactory::expressionPattern(&this->factory,pEVar4);
      pMVar6 = slang::syntax::SyntaxFactory::matchesClause
                         (&this->factory,matchesKeyword,&pEVar5->super_PatternSyntax);
    }
    else {
      pMVar6 = (MatchesClauseSyntax *)0x0;
    }
    expr = slang::syntax::SyntaxFactory::binSelectWithFilterExpr
                     (&this->factory,&expr->super_BinsSelectExpressionSyntax,TVar7,TVar8,pEVar3,
                      closeParen,pMVar6);
  }
  return &expr->super_BinsSelectExpressionSyntax;
}

Assistant:

BinsSelectExpressionSyntax& Parser::parseBinsSelectPrimary() {
    auto parseCondition = [&]() -> BinsSelectConditionExprSyntax& {
        auto binsof = expect(TokenKind::BinsOfKeyword);
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& name = parseName();
        auto closeParen = expect(TokenKind::CloseParenthesis);

        IntersectClauseSyntax* intersectClause = nullptr;
        if (peek(TokenKind::IntersectKeyword)) {
            auto intersect = consume();
            auto& ranges = parseRangeList();
            intersectClause = &factory.intersectClause(intersect, ranges);
        }

        return factory.binsSelectConditionExpr(binsof, openParen, name, closeParen,
                                               intersectClause);
    };

    auto parseMatches = [&] {
        MatchesClauseSyntax* matchesClause = nullptr;
        if (peek(TokenKind::MatchesKeyword)) {
            auto matches = consume();
            auto& matchExpr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            matchesClause = &factory.matchesClause(matches, factory.expressionPattern(matchExpr));
        }
        return matchesClause;
    };

    BinsSelectExpressionSyntax* result;
    switch (peek().kind) {
        case TokenKind::BinsOfKeyword:
            result = &parseCondition();
            break;
        case TokenKind::Exclamation: {
            auto op = consume();
            result = &factory.unaryBinsSelectExpr(op, parseCondition());
            break;
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseBinsSelectExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            result = &factory.parenthesizedBinsSelectExpr(openParen, expr, closeParen);
            break;
        }
        default: {
            auto& expr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            auto matches = parseMatches();
            result = &factory.simpleBinsSelectExpr(expr, matches);
            break;
        }
    }

    if (peek(TokenKind::WithKeyword)) {
        auto with = consume();
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& expr = parseExpression();
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto matches = parseMatches();
        result = &factory.binSelectWithFilterExpr(*result, with, openParen, expr, closeParen,
                                                  matches);
    }

    return *result;
}